

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecInt.h
# Opt level: O2

void Vec_IntFill(Vec_Int_t *p,int nSize,int Fill)

{
  int *piVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (p->nCap < nSize) {
    if (p->pArray == (int *)0x0) {
      piVar1 = (int *)malloc((long)nSize << 2);
    }
    else {
      piVar1 = (int *)realloc(p->pArray,(long)nSize << 2);
    }
    p->pArray = piVar1;
    if (piVar1 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    p->nCap = nSize;
  }
  uVar2 = 0;
  uVar3 = 0;
  if (0 < nSize) {
    uVar3 = (ulong)(uint)nSize;
  }
  for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    p->pArray[uVar2] = Fill;
  }
  p->nSize = nSize;
  return;
}

Assistant:

static inline void Vec_IntFill( Vec_Int_t * p, int nSize, int Fill )
{
    int i;
    Vec_IntGrow( p, nSize );
    for ( i = 0; i < nSize; i++ )
        p->pArray[i] = Fill;
    p->nSize = nSize;
}